

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O0

int Fraig_FeedBackCompress(Fraig_Man_t *p)

{
  uint *puVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  bool bVar5;
  int fPerformChecks;
  int *pPats;
  int local_28;
  int nPats;
  int t;
  int w;
  int i;
  uint uHash;
  uint *pSims;
  Fraig_Man_t *p_local;
  
  bVar5 = p->nBTLimit == -1;
  if ((bVar5) && (Fraig_FeedBackCheckTable(p), p->fDoSparse != 0)) {
    Fraig_FeedBackCheckTableF0(p);
  }
  Fraig_FeedBackCovering(p,p->vPatsReal);
  iVar2 = Msat_IntVecReadSize(p->vPatsReal);
  piVar3 = Msat_IntVecReadArray(p->vPatsReal);
  p->iWordStart = (p->iPatsPerm + iVar2 >> 5) + (uint)((p->iPatsPerm + iVar2 & 0x1fU) != 0);
  for (t = 0; t < p->vInputs->nSize; t = t + 1) {
    puVar1 = p->vInputs->pArray[t]->puSimD;
    for (nPats = p->iWordPerm; nPats < p->iWordStart; nPats = nPats + 1) {
      p->pSimsTemp[nPats] = 0;
    }
    for (local_28 = 0; local_28 < iVar2; local_28 = local_28 + 1) {
      if ((puVar1[piVar3[local_28] >> 5] & 1 << ((byte)piVar3[local_28] & 0x1f)) != 0) {
        if (p->iPatsPerm + local_28 < p->iWordPerm * 0x20) {
          iVar4 = p->iPatsPerm + local_28 >> 5;
          puVar1[iVar4] = 1 << ((char)p->iPatsPerm + (char)local_28 & 0x1fU) | puVar1[iVar4];
        }
        else {
          iVar4 = p->iPatsPerm + local_28 >> 5;
          p->pSimsTemp[iVar4] =
               1 << ((char)p->iPatsPerm + (char)local_28 & 0x1fU) | p->pSimsTemp[iVar4];
        }
      }
    }
    for (nPats = p->iWordPerm; nPats < p->iWordStart; nPats = nPats + 1) {
      puVar1[nPats] = p->pSimsTemp[nPats];
    }
    w = 0;
    for (nPats = 0; nPats < p->iWordStart; nPats = nPats + 1) {
      w = puVar1[nPats] * s_FraigPrimes[nPats] ^ w;
    }
    p->vInputs->pArray[t]->uHashD = w;
  }
  p->iWordPerm = p->iWordStart;
  p->iPatsPerm = iVar2 + p->iPatsPerm;
  if (p->iWordPerm != (p->iPatsPerm >> 5) + (uint)((p->iPatsPerm & 0x1fU) != 0)) {
    __assert_fail("p->iWordPerm == FRAIG_NUM_WORDS( p->iPatsPerm )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigFeed.c"
                  ,0x14e,"int Fraig_FeedBackCompress(Fraig_Man_t *)");
  }
  for (t = 1; t < p->vNodes->nSize; t = t + 1) {
    iVar2 = Fraig_NodeIsAnd(p->vNodes->pArray[t]);
    if (iVar2 != 0) {
      p->vNodes->pArray[t]->uHashD = 0;
      Fraig_NodeSimulate(p->vNodes->pArray[t],0,p->iWordPerm,0);
    }
  }
  if (bVar5) {
    Fraig_FeedBackCheckTable(p);
  }
  if ((p->fDoSparse != 0) && (Fraig_TableRehashF0(p,0), bVar5)) {
    Fraig_FeedBackCheckTableF0(p);
  }
  if (p->nWordsDyna < p->iWordPerm + 5) {
    Fraig_ReallocateSimulationInfo(p);
  }
  Msat_IntVecClear(p->vPatsReal);
  memset(p->pSimsReal,0,(long)p->nWordsDyna << 2);
  for (nPats = 0; nPats < p->iWordPerm; nPats = nPats + 1) {
    p->pSimsReal[nPats] = 0xffffffff;
  }
  if (0 < p->iPatsPerm % 0x20) {
    p->pSimsReal[p->iWordPerm + -1] = 0xffffffff >> (0x20U - (char)(p->iPatsPerm % 0x20) & 0x1f);
  }
  return p->iWordStart;
}

Assistant:

int Fraig_FeedBackCompress( Fraig_Man_t * p )
{
    unsigned * pSims;
    unsigned uHash;
    int i, w, t, nPats, * pPats;
    int fPerformChecks = (p->nBTLimit == -1);

    // solve the covering problem
    if ( fPerformChecks )
    {
        Fraig_FeedBackCheckTable( p );
        if ( p->fDoSparse ) 
            Fraig_FeedBackCheckTableF0( p );
    }

    // solve the covering problem
    Fraig_FeedBackCovering( p, p->vPatsReal );


    // get the number of additional patterns
    nPats = Msat_IntVecReadSize( p->vPatsReal );
    pPats = Msat_IntVecReadArray( p->vPatsReal );
    // get the new starting word
    p->iWordStart = FRAIG_NUM_WORDS( p->iPatsPerm + nPats );

    // set the simulation info for the PIs
    for ( i = 0; i < p->vInputs->nSize; i++ )
    {
        // get hold of the simulation info for this PI
        pSims = p->vInputs->pArray[i]->puSimD;
        // clean the storage for the new patterns
        for ( w = p->iWordPerm; w < p->iWordStart; w++ )
            p->pSimsTemp[w] = 0;
        // set the patterns
        for ( t = 0; t < nPats; t++ )
            if ( Fraig_BitStringHasBit( pSims, pPats[t] ) )
            {
                // check if this pattern falls into temporary storage
                if ( p->iPatsPerm + t < p->iWordPerm * 32 )
                    Fraig_BitStringSetBit( pSims, p->iPatsPerm + t );
                else
                    Fraig_BitStringSetBit( p->pSimsTemp, p->iPatsPerm + t );
            }
        // copy the pattern 
        for ( w = p->iWordPerm; w < p->iWordStart; w++ )
            pSims[w] = p->pSimsTemp[w];
        // recompute the hashing info
        uHash = 0;
        for ( w = 0; w < p->iWordStart; w++ )
            uHash ^= pSims[w] * s_FraigPrimes[w];
        p->vInputs->pArray[i]->uHashD = uHash;
    }

    // update info about the permanently stored patterns
    p->iWordPerm = p->iWordStart;
    p->iPatsPerm += nPats;
    assert( p->iWordPerm == FRAIG_NUM_WORDS( p->iPatsPerm ) );

    // resimulate and recompute the hash values
    for ( i = 1; i < p->vNodes->nSize; i++ )
        if ( Fraig_NodeIsAnd(p->vNodes->pArray[i]) )
        {
            p->vNodes->pArray[i]->uHashD = 0;
            Fraig_NodeSimulate( p->vNodes->pArray[i], 0, p->iWordPerm, 0 );
        }

    // double-check that the nodes are still distinguished
    if ( fPerformChecks )
        Fraig_FeedBackCheckTable( p );

    // rehash the values in the F0 table
    if ( p->fDoSparse ) 
    {
        Fraig_TableRehashF0( p, 0 );
        if ( fPerformChecks )
            Fraig_FeedBackCheckTableF0( p );
    }

    // check if we need to resize the simulation info
    // if less than FRAIG_WORDS_STORE words are left, reallocate simulation info
    if ( p->iWordPerm + FRAIG_WORDS_STORE > p->nWordsDyna )
        Fraig_ReallocateSimulationInfo( p );

    // set the real patterns
    Msat_IntVecClear( p->vPatsReal );
    memset( p->pSimsReal, 0, sizeof(unsigned)*p->nWordsDyna );
    for ( w = 0; w < p->iWordPerm; w++ )
        p->pSimsReal[w] = FRAIG_FULL;
    if ( p->iPatsPerm % 32 > 0 )
        p->pSimsReal[p->iWordPerm-1] = FRAIG_MASK( p->iPatsPerm % 32 );
//    printf( "The number of permanent words = %d.\n", p->iWordPerm );
    return p->iWordStart;
}